

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgram.h
# Opt level: O2

SamProgram * __thiscall BamTools::SamProgram::operator=(SamProgram *this,SamProgram *param_1)

{
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)(this + 0x20));
  std::__cxx11::string::_M_assign((string *)(this + 0x40));
  std::__cxx11::string::_M_assign((string *)(this + 0x60));
  std::__cxx11::string::_M_assign((string *)(this + 0x80));
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::operator=
            ((vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *)
             (this + 0xa0),
             (vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *)
             (param_1 + 0xa0));
  std::__cxx11::string::_M_assign((string *)(this + 0xb8));
  return this;
}

Assistant:

struct API_EXPORT SamProgram {

    // ctor & dtor
    SamProgram(void);
    SamProgram(const std::string& id);
    SamProgram(const SamProgram& other);
    ~SamProgram(void);

    // query/modify entire program record
    void Clear(void);                      // clears all data fields

    // convenience query methods
    bool HasCommandLine(void) const;       // returns true if program record has a command line entry
    bool HasID(void) const;                // returns true if program record has an ID
    bool HasName(void) const;              // returns true if program record has a name
    bool HasPreviousProgramID(void) const; // returns true if program record has a 'previous program ID'
    bool HasVersion(void) const;           // returns true if program record has a version

    // data members
    std::string CommandLine;               // CL:<CommandLine>
    std::string ID;                        // ID:<ID>          *Required for valid SAM header*
    std::string Name;                      // PN:<Name>
    std::string PreviousProgramID;         // PP:<PreviousProgramID>
    std::string Version;                   // VN:<Version>
    std::vector<CustomHeaderTag> CustomTags;   // optional custom tags

    // internal (non-standard) methods & fields
    private:
        bool HasNextProgramID(void) const;
        std::string NextProgramID;
        friend class BamTools::SamProgramChain;
}